

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSynchWaitController::RegisterWaitingThread
          (CSynchWaitController *this,WaitType wtWaitType,DWORD dwIndex,bool fAlertable)

{
  LONG *pLVar1;
  CSynchData *this_00;
  uint uVar2;
  bool bVar3;
  CPalSynchronizationManager *pCVar4;
  LONG LVar5;
  CPalThread *pCVar6;
  ThreadWaitInfo *ptwiWaitInfo;
  WaitingThreadsListNode *pwtlnNewNode;
  SynchDataGenrPtr SVar7;
  CProcProcessLocalData *pProcLocalData;
  ulong uVar8;
  undefined7 in_register_00000009;
  PAL_ERROR PVar9;
  _WaitingThreadsListNode *p_Var10;
  bool bVar11;
  _WaitingThreadsListNode *local_60;
  SHMPTR shridObj;
  WaitingThreadsListNode *local_50;
  uint local_44;
  CPalSynchronizationManager *local_40;
  ObjectDomain local_38;
  DWORD local_34;
  
  pCVar4 = CPalSynchronizationManager::s_pObjSynchMgr;
  local_44 = (uint)CONCAT71(in_register_00000009,fAlertable);
  local_38 = (this->super_CSynchControllerBase).m_odObjectDomain;
  local_34 = dwIndex;
  pCVar6 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar6 == (CPalThread *)0x0) {
    pCVar6 = CreateCurrentThreadData();
  }
  if (pCVar6 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x115);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo
                           ((this->super_CSynchControllerBase).m_pthrOwner);
  if (ptwiWaitInfo->pthrOwner != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x11a);
    fprintf(_stderr,"Expression: ptwiWaitInfo->pthrOwner == m_pthrOwner\n");
  }
  shridObj = (SHMPTR)SHMPtrToPtr((((this->super_CSynchControllerBase).m_pthrOwner)->
                                 synchronizationInfo).m_shridWaitAwakened);
  pCVar6 = (this->super_CSynchControllerBase).m_pthrOwner;
  local_40 = pCVar4;
  if (local_38 == SharedObject) {
    local_60 = (WaitingThreadsListNode *)0x0;
    CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
              (&pCVar4->m_cacheSHRWTListNodes,pCVar6,1,(SHMPTR *)&local_60);
    p_Var10 = local_60;
    pwtlnNewNode = (WaitingThreadsListNode *)SHMPtrToPtr((SHMPTR)local_60);
  }
  else {
    local_60 = (WaitingThreadsListNode *)0x0;
    CSynchCache<CorUnix::_WaitingThreadsListNode>::Get
              (&pCVar4->m_cacheWTListNodes,pCVar6,1,&local_60);
    p_Var10 = (WaitingThreadsListNode *)0x0;
    pwtlnNewNode = local_60;
  }
  local_50 = p_Var10;
  if (pwtlnNewNode == (WaitingThreadsListNode *)0x0) {
    if (p_Var10 != (WaitingThreadsListNode *)0x0 && local_38 == SharedObject) {
      local_34 = 0;
      fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0x12d);
      fprintf(_stderr,"Bad Shared Memory ptr %p\n",p_Var10);
      goto LAB_00344290;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034460f;
    PVar9 = 8;
    local_34 = 0;
  }
  else {
    if (ptwiWaitInfo->lObjCount < 0x40) {
      if (ptwiWaitInfo->lObjCount == 0) {
        ptwiWaitInfo->wtWaitType = wtWaitType;
        ptwiWaitInfo->wdWaitDomain = (this->super_CSynchControllerBase).m_wdWaitDomain;
      }
      else {
        if (ptwiWaitInfo->wtWaitType != wtWaitType) {
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x147);
          fprintf(_stderr,
                  "Expression: wtWaitType == ptwiWaitInfo->wtWaitType, Description: Conflicting wait types in wait registration\n"
                 );
        }
        if ((this->super_CSynchControllerBase).m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain) {
          ptwiWaitInfo->wdWaitDomain = MixedWait;
        }
      }
      uVar2 = (uint)(wtWaitType == MultipleObjectsWaitAll) * 2;
      pwtlnNewNode->shridSHRThis = 0;
      pwtlnNewNode->ptwiWaitInfo = ptwiWaitInfo;
      pwtlnNewNode->dwObjIndex = local_34;
      pwtlnNewNode->dwProcessId = gPID;
      pCVar6 = (this->super_CSynchControllerBase).m_pthrOwner;
      pwtlnNewNode->dwThreadId = (DWORD)pCVar6->m_threadId;
      pwtlnNewNode->dwFlags = uVar2;
      pwtlnNewNode->shridWaitingState = (pCVar6->synchronizationInfo).m_shridWaitAwakened;
      if (local_38 == SharedObject) {
        pwtlnNewNode->dwFlags = uVar2 | 1;
        pwtlnNewNode->shridSHRThis = (SHMPTR)p_Var10;
        SVar7 = (SynchDataGenrPtr)((this->super_CSynchControllerBase).m_psdSynchData)->m_shridThis;
      }
      else {
        SVar7 = (SynchDataGenrPtr)(this->super_CSynchControllerBase).m_psdSynchData;
      }
      pwtlnNewNode->ptrOwnerObjSynchData = SVar7;
      LOCK();
      pLVar1 = &((this->super_CSynchControllerBase).m_psdSynchData)->m_lRefCount;
      *pLVar1 = *pLVar1 + 1;
      UNLOCK();
      ptwiWaitInfo->rgpWTLNodes[ptwiWaitInfo->lObjCount] = pwtlnNewNode;
      PVar9 = 0;
      if (((this->super_CSynchControllerBase).m_psdSynchData)->m_otiObjectTypeId == otiProcess) {
        pProcLocalData = GetProcessLocalData(this);
        if (pProcLocalData == (CProcProcessLocalData *)0x0) {
          bVar11 = false;
          fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x172);
          fprintf(_stderr,"Process synch data pointer is missing\n");
          PVar9 = 0x54f;
        }
        else {
          PVar9 = CPalSynchronizationManager::RegisterProcessForMonitoring
                            (local_40,(this->super_CSynchControllerBase).m_pthrOwner,
                             (this->super_CSynchControllerBase).m_psdSynchData,pProcLocalData);
          bVar11 = PVar9 == 0;
        }
        if (!bVar11) {
          bVar11 = true;
          local_34 = 0;
          goto LAB_00344524;
        }
      }
      if (ptwiWaitInfo->lObjCount == 0) {
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_0034460f:
          abort();
        }
        uVar8 = 0;
        LOCK();
        if (*(uint *)shridObj == 0) {
          *(uint *)shridObj = (local_44 & 0xff) + 1;
        }
        else {
          uVar8 = (ulong)*(uint *)shridObj;
        }
        UNLOCK();
        bVar11 = true;
        if ((int)uVar8 == 0) {
          local_34 = 0;
          bVar3 = true;
        }
        else {
          if ((int)uVar8 == 3) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0034460f;
            PVar9 = 0xffffffff;
            local_34 = (DWORD)CONCAT71((int7)(uVar8 >> 8),1);
          }
          else {
            local_34 = 0;
            fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                    ,0x19a);
            fprintf(_stderr,"Unexpected thread wait state %d\n",uVar8);
            PVar9 = 0x54f;
          }
          bVar3 = false;
        }
        if (!bVar3) goto LAB_00344524;
      }
      else {
        local_34 = 0;
      }
      this_00 = (this->super_CSynchControllerBase).m_psdSynchData;
      if (local_38 == SharedObject) {
        CSynchData::SharedWaiterEnqueue(this_00,(SHMPTR)local_50);
        ptwiWaitInfo->lSharedObjCount = ptwiWaitInfo->lSharedObjCount + 1;
      }
      else {
        CSynchData::WaiterEnqueue(this_00,pwtlnNewNode);
      }
      ptwiWaitInfo->lObjCount = ptwiWaitInfo->lObjCount + 1;
      bVar11 = true;
      goto LAB_00344524;
    }
    local_34 = 0;
    fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x13a);
    fprintf(_stderr,"Too many objects");
LAB_00344290:
    PVar9 = 0x54f;
  }
  bVar11 = false;
LAB_00344524:
  if (PVar9 != 0) {
    CPalSynchronizationManager::UnRegisterWait
              (local_40,(this->super_CSynchControllerBase).m_pthrOwner,ptwiWaitInfo,
               local_38 == SharedObject);
    if (bVar11) {
      CSynchData::Release((this->super_CSynchControllerBase).m_psdSynchData,
                          (this->super_CSynchControllerBase).m_pthrOwner);
    }
    if (local_50 == (WaitingThreadsListNode *)0x0 || local_38 != SharedObject) {
      if (pwtlnNewNode != (WaitingThreadsListNode *)0x0) {
        CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&local_40->m_cacheWTListNodes,(this->super_CSynchControllerBase).m_pthrOwner,
                   pwtlnNewNode);
      }
    }
    else {
      CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                (&local_40->m_cacheSHRWTListNodes,(this->super_CSynchControllerBase).m_pthrOwner,
                 (SHMPTR)local_50);
    }
    if ((char)local_34 != '\0') {
      CPalSynchronizationManager::ResetSharedSynchLock
                ((this->super_CSynchControllerBase).m_pthrOwner);
      LVar5 = CPalSynchronizationManager::ResetLocalSynchLock
                        ((this->super_CSynchControllerBase).m_pthrOwner);
      if (LVar5 < 1) {
        fprintf(_stderr,"] %s %s:%d","RegisterWaitingThread",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                ,0x1cd);
        fprintf(_stderr,"Expression: 0 < lLocalSynchLockCount\n");
      }
      CPalSynchronizationManager::ThreadPrepareForShutdown();
    }
  }
  return PVar9;
}

Assistant:

PAL_ERROR CSynchWaitController::RegisterWaitingThread(
        WaitType wtWaitType,
        DWORD dwIndex,
        bool fAlertable)
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;
        WaitingThreadsListNode * pwtlnNewNode = NULL;
        SharedID shridNewNode = NULLSharedID;
        ThreadWaitInfo * ptwiWaitInfo; 
        DWORD * pdwWaitState;
        bool fSharedObject = (SharedObject == m_odObjectDomain);
        bool fEarlyDeath = false;
        bool fSynchDataRefd = false;
        CPalSynchronizationManager * pSynchManager = 
            CPalSynchronizationManager::GetInstance();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        
        ptwiWaitInfo = CPalSynchronizationManager::GetThreadWaitInfo(
            m_pthrOwner);

        _ASSERTE(ptwiWaitInfo->pthrOwner == m_pthrOwner);
        
        pdwWaitState = SharedIDToTypePointer(DWORD,
                m_pthrOwner->synchronizationInfo.m_shridWaitAwakened);

        if (fSharedObject)
        {
            shridNewNode = pSynchManager->CacheGetSharedWTListNode(m_pthrOwner);
            pwtlnNewNode = SharedIDToTypePointer(WaitingThreadsListNode, shridNewNode);
        }
        else
        {
            pwtlnNewNode = pSynchManager->CacheGetLocalWTListNode(m_pthrOwner);
        }
        
        if (!pwtlnNewNode)
        {
            if (fSharedObject && (NULLSharedID != shridNewNode))
            {
                ASSERT("Bad Shared Memory ptr %p\n", shridNewNode);
                palErr = ERROR_INTERNAL_ERROR;
            }        
            else
            {
                ERROR("Out of memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            goto RWT_exit;        
        }

        if (ptwiWaitInfo->lObjCount >= MAXIMUM_WAIT_OBJECTS)
        {
            ASSERT("Too many objects");
            palErr = ERROR_INTERNAL_ERROR; 
            goto RWT_exit;
        }       

        if (0 == ptwiWaitInfo->lObjCount)
        {
            ptwiWaitInfo->wtWaitType = wtWaitType;
            ptwiWaitInfo->wdWaitDomain = m_wdWaitDomain;
        } 
        else 
        {
            _ASSERT_MSG(wtWaitType == ptwiWaitInfo->wtWaitType,
                        "Conflicting wait types in wait registration\n");
            
            if (m_wdWaitDomain != ptwiWaitInfo->wdWaitDomain)
            {
                ptwiWaitInfo->wdWaitDomain = MixedWait;
            }
        }
        
        pwtlnNewNode->shridSHRThis       = NULLSharedID;
        pwtlnNewNode->ptwiWaitInfo       = ptwiWaitInfo;
        pwtlnNewNode->dwObjIndex         = dwIndex;
        pwtlnNewNode->dwProcessId        = gPID;
        pwtlnNewNode->dwThreadId         = m_pthrOwner->GetThreadId();
        pwtlnNewNode->dwFlags            = (MultipleObjectsWaitAll == wtWaitType) ? 
                                            WTLN_FLAG_WAIT_ALL : 0;
        pwtlnNewNode->shridWaitingState  = m_pthrOwner->synchronizationInfo.m_shridWaitAwakened; 
        if (fSharedObject)
        {
            pwtlnNewNode->dwFlags                   |= WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
            pwtlnNewNode->shridSHRThis               = shridNewNode;
            pwtlnNewNode->ptrOwnerObjSynchData.shrid = m_psdSynchData->GetSharedThis();
        }
        else
        {
            pwtlnNewNode->ptrOwnerObjSynchData.ptr = m_psdSynchData;
        }
        
        // AddRef the synch data (will be released in UnregisterWait)
        m_psdSynchData->AddRef();
        fSynchDataRefd = true;

        ptwiWaitInfo->rgpWTLNodes[ptwiWaitInfo->lObjCount] = pwtlnNewNode;

        if(otiProcess == m_psdSynchData->GetObjectTypeId())
        {
            CProcProcessLocalData * pProcLocalData = GetProcessLocalData();

            if (NULL == pProcLocalData)
            {
                // Process local data pointer not set in the controller.
                // This pointer is set in CSynchWaitController only when the
                // wait controller for the object is created by calling
                // GetSynchWaitControllersForObjects
                ASSERT("Process synch data pointer is missing\n");
                palErr = ERROR_INTERNAL_ERROR;
                goto RWT_exit;
            }
            
            palErr = pSynchManager->RegisterProcessForMonitoring(m_pthrOwner,
                                                                 m_psdSynchData, 
                                                                 pProcLocalData);            
            if (NO_ERROR != palErr)
            {
                goto RWT_exit;
            }
        }
        
        if (0 == ptwiWaitInfo->lObjCount)
        {
            DWORD dwWaitState;

            // Setting the thread in wait state 
            dwWaitState = (DWORD)(fAlertable ? TWS_ALERTABLE: TWS_WAITING);

            TRACE("Switching my wait state [%p] from TWS_ACTIVE to %u \n", 
                  pdwWaitState, dwWaitState);

            dwWaitState = InterlockedCompareExchange(
                (LONG *)pdwWaitState, (LONG)dwWaitState, TWS_ACTIVE);
            if ((DWORD)TWS_ACTIVE != dwWaitState)
            {
                if ((DWORD)TWS_EARLYDEATH == dwWaitState)
                {
                    // Process is terminating, this thread will soon be 
                    // suspended (by SuspendOtherThreads).
                    WARN("Thread is about to get suspended by "
                         "TerminateProcess\n");

                    fEarlyDeath = true;
                    palErr = WAIT_FAILED;
                }
                else
                {
                    ASSERT("Unexpected thread wait state %d\n", dwWaitState);
                    palErr = ERROR_INTERNAL_ERROR;
                }
                goto RWT_exit;
            }
        }

        // Add new node to queue
        if (fSharedObject)
        {
            m_psdSynchData->SharedWaiterEnqueue(shridNewNode);
            ptwiWaitInfo->lSharedObjCount += 1;
        }
        else
        {
            m_psdSynchData->WaiterEnqueue(pwtlnNewNode);
        }

        // Succeeded: update object count
        ptwiWaitInfo->lObjCount++;

    RWT_exit:
        if (palErr != NO_ERROR)
        {
            // Unregister any partial wait registration
            pSynchManager->UnRegisterWait(m_pthrOwner, ptwiWaitInfo, fSharedObject);
            
            if (fSynchDataRefd)
            {
                m_psdSynchData->Release(m_pthrOwner);
            }
            if ((fSharedObject)  && (NULLSharedID != shridNewNode))
            {
                pSynchManager->CacheAddSharedWTListNode(m_pthrOwner, shridNewNode);
            }
            else if (NULL != pwtlnNewNode)
            {
                pSynchManager->CacheAddLocalWTListNode(m_pthrOwner, pwtlnNewNode);
            }

            if (fEarlyDeath)
            {
                // Early death detected, i.e. the process is about to exit. 
                // We need to completely release the synch lock(s) before
                // going to sleep
                LONG lLocalSynchLockCount; 
                LONG lSharedSynchLockCount;
                                          
                lSharedSynchLockCount = CPalSynchronizationManager::ResetSharedSynchLock(m_pthrOwner);
                lLocalSynchLockCount = CPalSynchronizationManager::ResetLocalSynchLock(m_pthrOwner);

                _ASSERTE(0 < lLocalSynchLockCount);

                // Sleep for ever                
                CPalSynchronizationManager::ThreadPrepareForShutdown();
            }
        }
#ifdef SYNCH_STATISTICS
        else
        {
            m_psdSynchData->IncrementStatWaitCount();
            m_psdSynchData->IncrementStatContentionCount();
        }
#endif        
        return palErr;
    }